

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_string_radix_sort.h
# Opt level: O0

void __thiscall
parallel_string_radix_sort::ParallelStringRadixSort<const_unsigned_char_*>::Sort16Parallel
          (ParallelStringRadixSort<const_unsigned_char_*> *this,size_t bgn,size_t end,size_t depth,
          bool flip)

{
  size_t sVar1;
  uint16_t uVar2;
  ulong uVar3;
  size_t sStack_800d8;
  uchar **ppuStack_800c8;
  uchar **ppuStack_800c0;
  ulong uStack_800b0;
  size_t i_5;
  size_t j;
  size_t e;
  size_t b;
  ulong uStack_80088;
  int i_4;
  size_t i_3;
  unsigned_long uStack_80078;
  int i_2;
  size_t s;
  size_t i_1;
  ulong uStack_80060;
  uint16_t x;
  size_t i;
  size_t n;
  uint16_t *let;
  uchar **dst;
  uchar **src;
  size_t cnt [65536];
  bool flip_local;
  size_t depth_local;
  size_t end_local;
  size_t bgn_local;
  ParallelStringRadixSort<const_unsigned_char_*> *this_local;
  
  memset(&src,0,0x80000);
  if (flip) {
    ppuStack_800c0 = this->temp_;
  }
  else {
    ppuStack_800c0 = this->data_;
  }
  dst = ppuStack_800c0 + bgn;
  if (flip) {
    ppuStack_800c8 = this->data_;
  }
  else {
    ppuStack_800c8 = this->temp_;
  }
  let = (uint16_t *)(ppuStack_800c8 + bgn);
  n = (size_t)(this->letters16_ + bgn);
  i = end - bgn;
  for (uStack_80060 = 0; uStack_80060 < i; uStack_80060 = uStack_80060 + 1) {
    i_1._6_2_ = (ushort)dst[uStack_80060][depth];
    if (i_1._6_2_ == 0) {
      uVar2 = 0;
    }
    else {
      uVar2 = CONCAT11(dst[uStack_80060][depth],dst[uStack_80060][depth + 1]);
    }
    *(uint16_t *)(n + uStack_80060 * 2) = uVar2;
  }
  for (s = 0; s < i; s = s + 1) {
    cnt[(ulong)*(ushort *)(n + s * 2) - 1] = cnt[(ulong)*(ushort *)(n + s * 2) - 1] + 1;
  }
  uStack_80078 = 0;
  for (i_3._4_4_ = 0; i_3._4_4_ < 0x10000; i_3._4_4_ = i_3._4_4_ + 1) {
    std::swap<unsigned_long>(cnt + (long)i_3._4_4_ + -1,&stack0xfffffffffff7ff88);
    uStack_80078 = cnt[(long)i_3._4_4_ + -1] + uStack_80078;
  }
  for (uStack_80088 = 0; uStack_80088 < i; uStack_80088 = uStack_80088 + 1) {
    uVar3 = (ulong)*(ushort *)(n + uStack_80088 * 2);
    sVar1 = cnt[uVar3 - 1];
    cnt[uVar3 - 1] = sVar1 + 1;
    std::swap<unsigned_char_const*>((uchar **)(let + sVar1 * 4),dst + uStack_80088);
  }
  if (!flip) {
    for (b._4_4_ = 0; b._4_4_ < 0x100; b._4_4_ = b._4_4_ + 1) {
      if (b._4_4_ == 0) {
        sStack_800d8 = 0;
      }
      else {
        sStack_800d8 = cnt[(long)(b._4_4_ * 0x100 + -1) + -1];
      }
      uVar3 = cnt[(long)(b._4_4_ << 8) + -1];
      for (i_5 = sStack_800d8; i_5 < uVar3; i_5 = i_5 + 1) {
        dst[i_5] = *(uchar **)(let + i_5 * 4);
      }
    }
  }
  for (uStack_800b0 = 1; uStack_800b0 < 0x10000; uStack_800b0 = uStack_800b0 + 1) {
    if (((uStack_800b0 & 0xff) != 0) && (cnt[uStack_800b0 - 1] != cnt[uStack_800b0 - 2])) {
      Recurse(this,bgn + cnt[uStack_800b0 - 2],bgn + cnt[uStack_800b0 - 1],depth + 2,
              (bool)((flip ^ 0xffU) & 1));
    }
  }
  return;
}

Assistant:

void ParallelStringRadixSort<StringType>
::Sort16Parallel(size_t bgn, size_t end, size_t depth, bool flip) {
  size_t cnt[1 << 16] = {};

  StringType *src = (flip ? temp_ : data_) + bgn;
  StringType *dst = (flip ? data_ : temp_) + bgn;
  uint16_t *let = letters16_ + bgn;
  size_t n = end - bgn;

  #ifdef _OPENMP
  #pragma omp parallel for schedule(static)
  #endif
  for (size_t i = 0; i < n; ++i) {
    uint16_t x = src[i][depth];
    let[i] = x == 0 ? 0 : ((x << 8) | src[i][depth + 1]);
  }

  for (size_t i = 0; i < n; ++i) {
    ++cnt[let[i]];
  }

  {
    size_t s = 0;
    for (int i = 0; i < 1 << 16; ++i) {
      std::swap(cnt[i], s);
      s += cnt[i];
    }
  }

  for (size_t i = 0; i < n; ++i) {
    std::swap(dst[cnt[let[i]]++], src[i]);
  }

  if (flip == false) {
    #ifdef _OPENMP
    #pragma omp parallel for schedule(static)
    #endif
    for (int i = 0; i < 1 << 8; ++i) {
      size_t b = i == 0 ? 0 : cnt[(i << 8) - 1];
      size_t e = cnt[i << 8];
      for (size_t j = b; j < e; ++j) {
        src[j] = dst[j];
      }
    }
  }

  #ifdef _OPENMP
  #pragma omp parallel for schedule(dynamic)
  #endif
  for (size_t i = 1; i < 1 << 16; ++i) {
    if ((i & 0xFF) != 0 && cnt[i] - cnt[i - 1] >= 1) {
      Recurse(bgn + cnt[i - 1], bgn + cnt[i], depth + 2, !flip);
    }
  }
}